

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall google::protobuf::Message::CopyFrom(Message *this,Message *from)

{
  int iVar1;
  undefined4 extraout_var;
  Descriptor *pDVar2;
  LogMessage *pLVar3;
  string *psVar4;
  Descriptor *local_98;
  __0 local_86;
  LogFinisher local_85 [20];
  byte local_71;
  LogMessage local_70;
  Descriptor *local_38;
  Descriptor *descriptor;
  _func_void_Message_ptr_Message_ptr *copy_to_from;
  ClassData *class_from;
  ClassData *class_to;
  Message *from_local;
  Message *this_local;
  
  if (from != this) {
    class_to = (ClassData *)from;
    from_local = this;
    iVar1 = (*(this->super_MessageLite)._vptr_MessageLite[0x12])();
    class_from = (ClassData *)CONCAT44(extraout_var,iVar1);
    copy_to_from = (_func_void_Message_ptr_Message_ptr *)
                   (**(code **)(class_to->copy_to_from + 0x90))();
    if (class_from == (ClassData *)0x0) {
      local_98 = (Descriptor *)0x0;
    }
    else {
      local_98 = (Descriptor *)class_from->copy_to_from;
    }
    descriptor = local_98;
    if ((class_from == (ClassData *)0x0) || (class_from != (ClassData *)copy_to_from)) {
      local_38 = GetDescriptor(this);
      pDVar2 = GetDescriptor((Message *)class_to);
      local_71 = 0;
      if (pDVar2 != local_38) {
        internal::LogMessage::LogMessage
                  (&local_70,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message.cc"
                   ,0x6a);
        local_71 = 1;
        pLVar3 = internal::LogMessage::operator<<
                           (&local_70,"CHECK failed: (from.GetDescriptor()) == (descriptor): ");
        pLVar3 = internal::LogMessage::operator<<
                           (pLVar3,": Tried to copy from a message with a different type. to: ");
        psVar4 = Descriptor::full_name_abi_cxx11_(local_38);
        pLVar3 = internal::LogMessage::operator<<(pLVar3,psVar4);
        pLVar3 = internal::LogMessage::operator<<(pLVar3,", from: ");
        pDVar2 = GetDescriptor((Message *)class_to);
        psVar4 = Descriptor::full_name_abi_cxx11_(pDVar2);
        pLVar3 = internal::LogMessage::operator<<(pLVar3,psVar4);
        internal::LogFinisher::operator=(local_85,pLVar3);
      }
      if ((local_71 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_70);
      }
      descriptor = (Descriptor *)
                   CopyFrom(google::protobuf::Message_const&)::$_0::
                   operator_cast_to_function_pointer(&local_86);
    }
    (*(code *)descriptor)(this,class_to);
  }
  return;
}

Assistant:

void Message::CopyFrom(const Message& from) {
  if (&from == this) return;

  auto* class_to = GetClassData();
  auto* class_from = from.GetClassData();
  auto* copy_to_from = class_to ? class_to->copy_to_from : nullptr;

  if (class_to == nullptr || class_to != class_from) {
    const Descriptor* descriptor = GetDescriptor();
    GOOGLE_CHECK_EQ(from.GetDescriptor(), descriptor)
        << ": Tried to copy from a message with a different type. "
           "to: "
        << descriptor->full_name()
        << ", "
           "from: "
        << from.GetDescriptor()->full_name();
    copy_to_from = [](Message* to, const Message& from) {
      ReflectionOps::Copy(from, to);
    };
  }
  copy_to_from(this, from);
}